

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,Options *options)

{
  bool bVar1;
  ObjectiveCType OVar2;
  MapFieldGenerator *local_20;
  FieldGenerator *result;
  Options *options_local;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    OVar2 = GetObjectiveCType(field);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      local_20 = (MapFieldGenerator *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)local_20,field,options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        local_20 = (MapFieldGenerator *)operator_new(0x48);
        MapFieldGenerator::MapFieldGenerator(local_20,field,options);
      }
      else {
        local_20 = (MapFieldGenerator *)operator_new(0x40);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)local_20,field,options);
      }
    }
    else {
      local_20 = (MapFieldGenerator *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)local_20,field,options);
    }
  }
  else {
    OVar2 = GetObjectiveCType(field);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      local_20 = (MapFieldGenerator *)operator_new(0x40);
      EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)local_20,field,options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      local_20 = (MapFieldGenerator *)operator_new(0x40);
      MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)local_20,field,options);
    }
    else {
      bVar1 = IsReferenceType(field);
      if (bVar1) {
        local_20 = (MapFieldGenerator *)operator_new(0x40);
        PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                  ((PrimitiveObjFieldGenerator *)local_20,field,options);
      }
      else {
        local_20 = (MapFieldGenerator *)operator_new(0x40);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)local_20,field,options);
      }
    }
  }
  (*(local_20->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
    super_FieldGenerator._vptr_FieldGenerator[0xb])();
  return (FieldGenerator *)local_20;
}

Assistant:

FieldGenerator* FieldGenerator::Make(const FieldDescriptor* field,
                                     const Options& options) {
  FieldGenerator* result = NULL;
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          result = new MapFieldGenerator(field, options);
        } else {
          result = new RepeatedMessageFieldGenerator(field, options);
        }
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new RepeatedEnumFieldGenerator(field, options);
        break;
      default:
        result = new RepeatedPrimitiveFieldGenerator(field, options);
        break;
    }
  } else {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        result = new MessageFieldGenerator(field, options);
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new EnumFieldGenerator(field, options);
        break;
      default:
        if (IsReferenceType(field)) {
          result = new PrimitiveObjFieldGenerator(field, options);
        } else {
          result = new PrimitiveFieldGenerator(field, options);
        }
        break;
    }
  }
  result->FinishInitialization();
  return result;
}